

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O1

Remotes * Omega_h::globals_to_linear_owners
                    (Remotes *__return_storage_ptr__,Read<long> *globals,GO total,I32 comm_size)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Alloc *pAVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  Remotes *this;
  long lVar7;
  ulong **__dest;
  long *plVar8;
  ulong *puVar9;
  undefined4 uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  size_t sVar14;
  size_type sVar15;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> idxs;
  Write<int> ranks;
  size_type __dnew;
  type f;
  ScopedTimer local_191;
  string local_190;
  void *local_170;
  long local_168;
  Alloc *local_160;
  void *local_158;
  long local_150;
  Write<int> local_148;
  Write<int> local_138;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  Write<int> local_e8;
  Write<int> local_d8;
  Alloc *local_c8;
  void *pvStack_c0;
  size_t local_b8;
  Alloc *local_b0;
  void *pvStack_a8;
  long local_a0;
  Alloc *local_98;
  void *pvStack_90;
  long local_88;
  Remotes *local_78;
  Read<signed_char> local_70;
  Read<signed_char> local_60;
  ulong **local_50;
  ulong *local_48;
  ulong *local_40 [2];
  
  lVar7 = total / (long)comm_size;
  lVar11 = total % (long)comm_size;
  pAVar3 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar14 = pAVar3->size;
  }
  else {
    sVar14 = (ulong)pAVar3 >> 3;
  }
  paVar2 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar2;
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  Write<int>::Write(&local_138,(LO)(sVar14 >> 3),&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar14 = pAVar3->size;
  }
  else {
    sVar14 = (ulong)pAVar3 >> 3;
  }
  local_190._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  Write<int>::Write(&local_148,(LO)(sVar14 >> 3),&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_b8 = (lVar7 + 1) * lVar11;
  pAVar3 = (globals->write_).shared_alloc_.alloc;
  local_c8 = pAVar3;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&pAVar3->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  pvStack_c0 = (globals->write_).shared_alloc_.direct_ptr;
  local_b0 = local_138.shared_alloc_.alloc;
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)((local_138.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_138.shared_alloc_.alloc)->use_count = (local_138.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_a8 = local_138.shared_alloc_.direct_ptr;
  local_98 = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_90 = local_148.shared_alloc_.direct_ptr;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar15 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pAVar3->size)->_M_allocated_capacity;
  }
  else {
    sVar15 = (ulong)pAVar3 >> 3;
  }
  local_128 = (ulong *)0x5d;
  local_a0 = lVar7;
  local_88 = lVar11;
  local_50 = local_40;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_128);
  puVar9 = local_128;
  local_40[0] = local_128;
  local_50 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_48 = puVar9;
  *(undefined1 *)((long)__dest + (long)puVar9) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar9) {
    local_f8 = *puVar9;
    lStack_f0 = plVar8[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar9;
    local_108 = (ulong *)*plVar8;
  }
  local_100 = plVar8[1];
  *plVar8 = (long)puVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_128 = local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x02');
  *(undefined2 *)local_128 = 0x3438;
  uVar12 = 0xf;
  if (local_108 != &local_f8) {
    uVar12 = local_f8;
  }
  if (uVar12 < (ulong)(local_120 + local_100)) {
    uVar12 = 0xf;
    if (local_128 != local_118) {
      uVar12 = local_118[0];
    }
    if ((ulong)(local_120 + local_100) <= uVar12) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_128,0,(char *)0x0,(ulong)local_108);
      goto LAB_002f6bb6;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
LAB_002f6bb6:
  pAVar3 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar3) {
    local_190.field_2._M_allocated_capacity = pAVar3->size;
    local_190.field_2._8_8_ = plVar8[3];
    local_190._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_190.field_2._M_allocated_capacity = pAVar3->size;
    local_190._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_190._M_string_length = plVar8[1];
  *plVar8 = (long)pAVar3;
  plVar8[1] = 0;
  *(undefined1 *)&pAVar3->size = 0;
  begin_code("parallel_for",local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(long)local_40[0] + 1);
  }
  this = local_78;
  pvVar6 = pvStack_90;
  pvVar5 = pvStack_a8;
  pvVar4 = pvStack_c0;
  iVar13 = (int)(sVar15 >> 3);
  if (0 < iVar13) {
    local_190._M_dataplus._M_p = (pointer)local_c8;
    local_190._M_string_length = (size_type)pvStack_c0;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_190._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_c8->size)->_M_allocated_capacity * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    pvStack_c0 = (void *)0x0;
    local_190.field_2._M_allocated_capacity = local_b8;
    local_190.field_2._8_8_ = local_b0;
    local_170 = pvStack_a8;
    if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
      local_b0->use_count = local_b0->use_count + -1;
      local_190.field_2._8_8_ = local_b0->size * 8 + 1;
    }
    local_b0 = (Alloc *)0x0;
    pvStack_a8 = (void *)0x0;
    local_168 = local_a0;
    local_160 = local_98;
    local_158 = pvStack_90;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_160 = (Alloc *)(local_98->size * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    local_150 = local_88;
    entering_parallel = '\0';
    lVar7 = 0;
    do {
      lVar11 = *(long *)((long)pvVar4 + lVar7 * 8);
      if (lVar11 < (long)local_b8) {
        uVar10 = (undefined4)(lVar11 % (local_a0 + 1));
        *(int *)((long)pvVar5 + lVar7 * 4) = (int)(lVar11 / (local_a0 + 1));
      }
      else {
        uVar10 = (undefined4)((long)(lVar11 - local_b8) % local_a0);
        *(int *)((long)pvVar5 + lVar7 * 4) =
             (int)((long)(lVar11 - local_b8) / local_a0) + (int)local_88;
      }
      *(undefined4 *)((long)pvVar6 + lVar7 * 4) = uVar10;
      lVar7 = lVar7 + 1;
    } while (iVar13 != (int)lVar7);
    globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)&local_190);
  }
  ScopedTimer::~ScopedTimer(&local_191);
  local_d8.shared_alloc_.alloc = local_138.shared_alloc_.alloc;
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.shared_alloc_.alloc = (Alloc *)((local_138.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_138.shared_alloc_.alloc)->use_count = (local_138.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8.shared_alloc_.direct_ptr = local_138.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_60,&local_d8);
  local_e8.shared_alloc_.alloc = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8.shared_alloc_.alloc = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e8.shared_alloc_.direct_ptr = local_148.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_70,&local_e8);
  Remotes::Remotes(this,(Read<int> *)&local_60,(LOs *)&local_70);
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(local_70.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(local_60.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)&local_c8);
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.shared_alloc_.alloc);
      operator_delete(local_148.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_138.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138.shared_alloc_.alloc);
      operator_delete(local_138.shared_alloc_.alloc,0x48);
    }
  }
  return this;
}

Assistant:

Remotes globals_to_linear_owners(Read<GO> globals, GO total, I32 comm_size) {
  auto const comm_size_gt = GO(comm_size);
  auto const quot = total / comm_size_gt;
  auto const rem = total % comm_size_gt;
  auto const split = ((quot + 1) * rem);
  Write<I32> ranks(globals.size());
  Write<LO> idxs(globals.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (globals[i] < split) {
      ranks[i] = static_cast<I32>(globals[i] / (quot + 1));
      idxs[i] = static_cast<LO>(globals[i] % (quot + 1));
    } else {
      auto const g = globals[i] - split;
      ranks[i] = static_cast<I32>(g / quot + rem);
      idxs[i] = static_cast<LO>(g % quot);
    }
  };
  parallel_for(globals.size(), std::move(f));
  return Remotes(ranks, idxs);
}